

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catmullclark_patch.h
# Opt level: O3

void __thiscall
embree::GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>::subdivide
          (GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *this,
          array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_16UL> *patch,uint *N_o
          )

{
  DynamicStackArray<float,_16UL,_64UL> *pDVar1;
  uint *puVar2;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *pDVar3;
  undefined8 *puVar4;
  Vec3fa *pVVar5;
  undefined8 *puVar6;
  uint uVar7;
  GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *pGVar8;
  long *plVar9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  long lVar12;
  undefined8 uVar13;
  array_t<embree::CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>,_4UL> *paVar14;
  size_t i;
  long lVar15;
  Vec3fa *pVVar16;
  float *pfVar17;
  ulong uVar18;
  Vec3fa **ppVVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  Face *pFVar25;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *pDVar26;
  DynamicStackArray<float,_16UL,_64UL> *pDVar27;
  uint uVar28;
  ulong uVar29;
  GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *pGVar30;
  ulong uVar31;
  long lVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar40;
  float fVar41;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  Vec3fa VVar39;
  float fVar42;
  undefined1 auVar43 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  array_t<embree::Vec3fa,_32UL> center_ring;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  ulong local_268;
  undefined8 local_238;
  long local_230;
  float afStack_228 [2];
  undefined8 auStack_220 [62];
  
  uVar28 = this->N;
  uVar31 = (ulong)uVar28;
  *N_o = uVar28;
  if (uVar28 != 0) {
    pDVar26 = &patch->items[0].ring.items[0].ring;
    pDVar27 = &patch->items[0].ring.items[0].crease_weight;
    uVar29 = 0;
    do {
      pGVar8 = (this->ring).data;
      pGVar30 = pGVar8 + uVar29;
      patch->items[uVar29].ring.items[0].edge_level = pGVar8[uVar29].edge_level * 0.5;
      patch->items[uVar29].ring.items[0].vertex_level = pGVar8[uVar29].vertex_level * 0.5;
      uVar28 = pGVar8[uVar29].face_valence;
      patch->items[uVar29].ring.items[0].face_valence = uVar28;
      patch->items[uVar29].ring.items[0].edge_valence = uVar28 * 2;
      iVar23 = pGVar8[uVar29].border_face * 2;
      if (pGVar8[uVar29].border_face == -1) {
        iVar23 = -1;
      }
      patch->items[uVar29].ring.items[0].border_index = iVar23;
      fVar33 = pGVar8[uVar29].vertex_crease_weight + -1.0;
      if (fVar33 <= 0.0) {
        fVar33 = 0.0;
      }
      patch->items[uVar29].ring.items[0].vertex_crease_weight = fVar33;
      patch->items[uVar29].ring.items[0].eval_start_index = pGVar8[uVar29].eval_start_face_index;
      patch->items[uVar29].ring.items[0].eval_unique_identifier =
           pGVar8[uVar29].eval_unique_identifier;
      uVar20 = (ulong)pGVar8[uVar29].face_valence;
      if (uVar20 == 0) {
        fVar33 = 0.0;
        local_2d8 = 0.0;
        fStack_2d4 = 0.0;
        fStack_2d0 = 0.0;
        fStack_2cc = 0.0;
        fVar45 = 0.0;
        fVar46 = 0.0;
        fVar47 = 0.0;
        fVar48 = 0.0;
        local_268 = 0;
      }
      else {
        uVar21 = (ulong)pGVar30->eval_start_vertex_index;
        pDVar3 = &patch->items[uVar29].ring.items[0].ring;
        pFVar25 = (pGVar30->faces).data;
        fVar45 = 0.0;
        fVar46 = 0.0;
        fVar47 = 0.0;
        fVar48 = 0.0;
        uVar22 = 0;
        do {
          uVar20 = (pGVar30->eval_start_face_index + uVar22) % uVar20;
          auVar38 = *(undefined1 (*) [16])(pGVar30->vtx).field_0.m128;
          iVar23 = pFVar25[uVar20].size;
          if (!CARRY8(uVar21,(long)iVar23)) {
            uVar18 = uVar21;
            auVar37 = auVar38;
            do {
              pVVar16 = (pGVar30->ring).data + uVar18 % (ulong)pGVar30->edge_valence;
              auVar38._0_4_ = auVar37._0_4_ + (pVVar16->field_0).m128[0];
              auVar38._4_4_ = auVar37._4_4_ + (pVVar16->field_0).m128[1];
              auVar38._8_4_ = auVar37._8_4_ + (pVVar16->field_0).m128[2];
              auVar38._12_4_ = auVar37._12_4_ + (pVVar16->field_0).m128[3];
              uVar18 = uVar18 + 1;
              auVar37 = auVar38;
            } while (uVar18 <= uVar21 + (long)iVar23);
          }
          pVVar16 = patch->items[uVar29].ring.items[0].ring.data;
          if ((0xf < uVar20) &&
             ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar16 == pDVar3)) {
            pVVar16 = (Vec3fa *)alignedMalloc(0x800,0x10);
            patch->items[uVar29].ring.items[0].ring.data = pVVar16;
            lVar32 = 0;
            do {
              puVar6 = (undefined8 *)((long)&pDVar26->arr[0].field_0 + lVar32);
              uVar11 = puVar6[1];
              puVar4 = (undefined8 *)
                       ((long)&(patch->items[uVar29].ring.items[0].ring.data)->field_0 + lVar32);
              *puVar4 = *puVar6;
              puVar4[1] = uVar11;
              lVar32 = lVar32 + 0x10;
            } while (lVar32 != 0x200);
            pVVar16 = patch->items[uVar29].ring.items[0].ring.data;
          }
          fVar33 = (float)(iVar23 + 2);
          auVar37._4_4_ = fVar33;
          auVar37._0_4_ = fVar33;
          auVar37._8_4_ = fVar33;
          auVar37._12_4_ = fVar33;
          VVar39.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)divps(auVar38,auVar37);
          pVVar16[uVar20 * 2 + 1].field_0 = VVar39.field_0;
          fVar45 = fVar45 + VVar39.field_0._0_4_;
          fVar46 = fVar46 + VVar39.field_0._4_4_;
          fVar47 = fVar47 + VVar39.field_0._8_4_;
          fVar48 = fVar48 + VVar39.field_0._12_4_;
          pFVar25 = (pGVar30->faces).data;
          uVar21 = (uVar21 + (long)pFVar25[uVar20].size) % (ulong)pGVar30->edge_valence;
          uVar22 = uVar22 + 1;
          uVar20 = (ulong)pGVar30->face_valence;
        } while (uVar22 < uVar20);
        if (uVar20 == 0) {
          fVar33 = 0.0;
          local_2d8 = 0.0;
          fStack_2d4 = 0.0;
          fStack_2d0 = 0.0;
          fStack_2cc = 0.0;
          local_268 = 0;
        }
        else {
          uVar21 = (ulong)pGVar30->eval_start_vertex_index;
          local_2d8 = 0.0;
          fStack_2d4 = 0.0;
          fStack_2d0 = 0.0;
          fStack_2cc = 0.0;
          local_268 = 0;
          uVar22 = 0;
          do {
            uVar20 = (pGVar30->eval_start_face_index + uVar22) % uVar20;
            pVVar16 = (pGVar30->ring).data + uVar21;
            fVar33 = (pGVar30->vtx).field_0.m128[0] + (pVVar16->field_0).m128[0];
            fVar49 = (pGVar30->vtx).field_0.m128[1] + (pVVar16->field_0).m128[1];
            fVar50 = (pGVar30->vtx).field_0.m128[2] + (pVVar16->field_0).m128[2];
            fVar51 = (pGVar30->vtx).field_0.m128[3] + (pVVar16->field_0).m128[3];
            uVar18 = uVar20 * 2 + 1;
            pVVar16 = patch->items[uVar29].ring.items[0].ring.data;
            if (uVar20 < 0x10) {
LAB_00d73a4d:
              pVVar5 = pVVar16 + uVar18;
              fVar35 = (pVVar5->field_0).m128[0];
              fVar40 = (pVVar5->field_0).m128[1];
              fVar41 = (pVVar5->field_0).m128[2];
              fVar42 = (pVVar5->field_0).m128[3];
              if (uVar20 != 0) goto LAB_00d73a5d;
              uVar28 = patch->items[uVar29].ring.items[0].edge_valence;
              if ((0x20 < uVar28) &&
                 ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar16 == pDVar3)) {
                pVVar16 = (Vec3fa *)alignedMalloc(0x800,0x10);
                patch->items[uVar29].ring.items[0].ring.data = pVVar16;
                lVar32 = 0;
                do {
                  puVar6 = (undefined8 *)((long)&pDVar26->arr[0].field_0 + lVar32);
                  uVar11 = puVar6[1];
                  puVar4 = (undefined8 *)
                           ((long)&(patch->items[uVar29].ring.items[0].ring.data)->field_0 + lVar32)
                  ;
                  *puVar4 = *puVar6;
                  puVar4[1] = uVar11;
                  lVar32 = lVar32 + 0x10;
                } while (lVar32 != 0x200);
                pVVar16 = patch->items[uVar29].ring.items[0].ring.data;
              }
              pVVar16 = pVVar16 + (uVar28 - 1);
            }
            else {
              if ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar16 == pDVar3) {
                pVVar16 = (Vec3fa *)alignedMalloc(0x800,0x10);
                patch->items[uVar29].ring.items[0].ring.data = pVVar16;
                lVar32 = 0;
                do {
                  puVar6 = (undefined8 *)((long)&pDVar26->arr[0].field_0 + lVar32);
                  uVar11 = puVar6[1];
                  puVar4 = (undefined8 *)
                           ((long)&(patch->items[uVar29].ring.items[0].ring.data)->field_0 + lVar32)
                  ;
                  *puVar4 = *puVar6;
                  puVar4[1] = uVar11;
                  lVar32 = lVar32 + 0x10;
                } while (lVar32 != 0x200);
                pVVar16 = patch->items[uVar29].ring.items[0].ring.data;
                goto LAB_00d73a4d;
              }
              pVVar5 = pVVar16 + uVar18;
              fVar35 = (pVVar5->field_0).m128[0];
              fVar40 = (pVVar5->field_0).m128[1];
              fVar41 = (pVVar5->field_0).m128[2];
              fVar42 = (pVVar5->field_0).m128[3];
LAB_00d73a5d:
              if ((0x10 < uVar20) &&
                 ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar16 == pDVar3)) {
                pVVar16 = (Vec3fa *)alignedMalloc(0x800,0x10);
                patch->items[uVar29].ring.items[0].ring.data = pVVar16;
                lVar32 = 0;
                do {
                  puVar6 = (undefined8 *)((long)&pDVar26->arr[0].field_0 + lVar32);
                  uVar11 = puVar6[1];
                  puVar4 = (undefined8 *)
                           ((long)&(patch->items[uVar29].ring.items[0].ring.data)->field_0 + lVar32)
                  ;
                  *puVar4 = *puVar6;
                  puVar4[1] = uVar11;
                  lVar32 = lVar32 + 0x10;
                } while (lVar32 != 0x200);
                pVVar16 = patch->items[uVar29].ring.items[0].ring.data;
              }
              pVVar16 = pVVar16 + uVar20 * 2 + -1;
            }
            fVar35 = fVar35 + (pVVar16->field_0).m128[0];
            fVar40 = fVar40 + (pVVar16->field_0).m128[1];
            fVar41 = fVar41 + (pVVar16->field_0).m128[2];
            fVar42 = fVar42 + (pVVar16->field_0).m128[3];
            pVVar16 = (pGVar30->ring).data + uVar21;
            fVar45 = fVar45 + (pVVar16->field_0).m128[0];
            fVar46 = fVar46 + (pVVar16->field_0).m128[1];
            fVar47 = fVar47 + (pVVar16->field_0).m128[2];
            fVar48 = fVar48 + (pVVar16->field_0).m128[3];
            fVar34 = (pGVar30->faces).data[uVar20].crease_weight + -1.0;
            pfVar17 = patch->items[uVar29].ring.items[0].crease_weight.data;
            if ((0xf < uVar20) &&
               ((DynamicStackArray<float,_16UL,_64UL> *)pfVar17 ==
                &patch->items[uVar29].ring.items[0].crease_weight)) {
              pfVar17 = (float *)operator_new__(0x100);
              patch->items[uVar29].ring.items[0].crease_weight.data = pfVar17;
              lVar32 = 0;
              do {
                patch->items[uVar29].ring.items[0].crease_weight.data[lVar32] = pDVar27->arr[lVar32]
                ;
                lVar32 = lVar32 + 1;
              } while (lVar32 != 0x10);
              pfVar17 = patch->items[uVar29].ring.items[0].crease_weight.data;
            }
            fVar36 = 0.0;
            if (0.0 <= fVar34) {
              fVar36 = fVar34;
            }
            pfVar17[uVar20] = fVar36;
            if (0.0 < (pGVar30->faces).data[uVar20].crease_weight) {
              pVVar16 = (pGVar30->ring).data + uVar21;
              local_2d8 = local_2d8 + (pVVar16->field_0).m128[0];
              fStack_2d4 = fStack_2d4 + (pVVar16->field_0).m128[1];
              fStack_2d0 = fStack_2d0 + (pVVar16->field_0).m128[2];
              fStack_2cc = fStack_2cc + (pVVar16->field_0).m128[3];
              (&local_238)[local_268] = uVar20;
              pVVar16 = patch->items[uVar29].ring.items[0].ring.data;
              if ((0x20 < uVar18) &&
                 ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar16 == pDVar3)) {
                pVVar16 = (Vec3fa *)alignedMalloc(0x800,0x10);
                patch->items[uVar29].ring.items[0].ring.data = pVVar16;
                lVar32 = 0;
                do {
                  puVar6 = (undefined8 *)((long)&pDVar26->arr[0].field_0 + lVar32);
                  uVar11 = puVar6[1];
                  puVar4 = (undefined8 *)
                           ((long)&(patch->items[uVar29].ring.items[0].ring.data)->field_0 + lVar32)
                  ;
                  *puVar4 = *puVar6;
                  puVar4[1] = uVar11;
                  lVar32 = lVar32 + 0x10;
                } while (lVar32 != 0x200);
                pVVar16 = patch->items[uVar29].ring.items[0].ring.data;
              }
              local_268 = local_268 + 1;
              pVVar16 = pVVar16 + uVar20 * 2;
              (pVVar16->field_0).m128[0] = fVar33 * 0.5;
              (pVVar16->field_0).m128[1] = fVar49 * 0.5;
              (pVVar16->field_0).m128[2] = fVar50 * 0.5;
              (pVVar16->field_0).m128[3] = fVar51 * 0.5;
              fVar34 = (pGVar30->faces).data[uVar20].crease_weight;
              if (fVar34 < 1.0) {
                fVar36 = 1.0 - fVar34;
                local_278 = (fVar33 + fVar35) * 0.25 * fVar36 + fVar33 * 0.5 * fVar34;
                fStack_274 = (fVar49 + fVar40) * 0.25 * fVar36 + fVar49 * 0.5 * fVar34;
                fStack_270 = (fVar50 + fVar41) * 0.25 * fVar36 + fVar50 * 0.5 * fVar34;
                fStack_26c = (fVar51 + fVar42) * 0.25 * fVar36 + fVar51 * 0.5 * fVar34;
                pVVar16 = patch->items[uVar29].ring.items[0].ring.data;
                if ((0x20 < uVar18) &&
                   ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar16 == pDVar3)) {
                  pVVar16 = (Vec3fa *)alignedMalloc(0x800,0x10);
                  patch->items[uVar29].ring.items[0].ring.data = pVVar16;
                  lVar32 = 0;
                  do {
                    puVar6 = (undefined8 *)((long)&pDVar26->arr[0].field_0 + lVar32);
                    uVar11 = puVar6[1];
                    puVar4 = (undefined8 *)
                             ((long)&(patch->items[uVar29].ring.items[0].ring.data)->field_0 +
                             lVar32);
                    *puVar4 = *puVar6;
                    puVar4[1] = uVar11;
                    lVar32 = lVar32 + 0x10;
                  } while (lVar32 != 0x200);
                  goto LAB_00d73e3c;
                }
                goto LAB_00d73b0b;
              }
            }
            else {
              local_278 = (fVar33 + fVar35) * 0.25;
              fStack_274 = (fVar49 + fVar40) * 0.25;
              fStack_270 = (fVar50 + fVar41) * 0.25;
              fStack_26c = (fVar51 + fVar42) * 0.25;
              pVVar16 = patch->items[uVar29].ring.items[0].ring.data;
              if ((0x20 < uVar18) &&
                 ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar16 == pDVar3)) {
                pVVar16 = (Vec3fa *)alignedMalloc(0x800,0x10);
                patch->items[uVar29].ring.items[0].ring.data = pVVar16;
                lVar32 = 0;
                do {
                  puVar6 = (undefined8 *)((long)&pDVar26->arr[0].field_0 + lVar32);
                  uVar11 = puVar6[1];
                  puVar4 = (undefined8 *)
                           ((long)&(patch->items[uVar29].ring.items[0].ring.data)->field_0 + lVar32)
                  ;
                  *puVar4 = *puVar6;
                  puVar4[1] = uVar11;
                  lVar32 = lVar32 + 0x10;
                } while (lVar32 != 0x200);
LAB_00d73e3c:
                pVVar16 = patch->items[uVar29].ring.items[0].ring.data;
              }
LAB_00d73b0b:
              pVVar16 = pVVar16 + uVar20 * 2;
              (pVVar16->field_0).m128[0] = local_278;
              (pVVar16->field_0).m128[1] = fStack_274;
              (pVVar16->field_0).m128[2] = fStack_270;
              (pVVar16->field_0).m128[3] = fStack_26c;
            }
            uVar21 = (uVar21 + (long)(pGVar30->faces).data[uVar20].size) %
                     (ulong)pGVar30->edge_valence;
            uVar22 = uVar22 + 1;
            uVar20 = (ulong)pGVar30->face_valence;
          } while (uVar22 < uVar20);
          fVar33 = (float)uVar20;
        }
      }
      lVar12 = local_230;
      lVar32 = local_238;
      fVar49 = 1.0 / fVar33;
      fVar33 = fVar33 + -2.0;
      fVar45 = (fVar45 * fVar49 + fVar33 * (pGVar30->vtx).field_0.m128[0]) * fVar49;
      fVar46 = (fVar46 * fVar49 + fVar33 * (pGVar30->vtx).field_0.m128[1]) * fVar49;
      fVar47 = (fVar47 * fVar49 + fVar33 * (pGVar30->vtx).field_0.m128[2]) * fVar49;
      fVar49 = (fVar48 * fVar49 + fVar33 * (pGVar30->vtx).field_0.m128[3]) * fVar49;
      patch->items[uVar29].ring.items[0].vtx.field_0.m128[0] = fVar45;
      patch->items[uVar29].ring.items[0].vtx.field_0.m128[1] = fVar46;
      patch->items[uVar29].ring.items[0].vtx.field_0.m128[2] = fVar47;
      patch->items[uVar29].ring.items[0].vtx.field_0.m128[3] = fVar49;
      fVar33 = pGVar30->vertex_crease_weight;
      if (0.0 < fVar33) {
        if (1.0 <= fVar33) {
          fVar48 = (pGVar30->vtx).field_0.m128[0];
          fVar50 = (pGVar30->vtx).field_0.m128[1];
          fVar51 = (pGVar30->vtx).field_0.m128[2];
          fVar33 = (pGVar30->vtx).field_0.m128[3];
        }
        else {
          fVar35 = 1.0 - fVar33;
          fVar48 = fVar35 * (pGVar30->vtx).field_0.m128[0] + fVar45 * fVar33;
          fVar50 = fVar35 * (pGVar30->vtx).field_0.m128[1] + fVar46 * fVar33;
          fVar51 = fVar35 * (pGVar30->vtx).field_0.m128[2] + fVar47 * fVar33;
          fVar33 = fVar35 * (pGVar30->vtx).field_0.m128[3] + fVar49 * fVar33;
        }
LAB_00d745b3:
        patch->items[uVar29].ring.items[0].vtx.field_0.m128[0] = fVar48;
        patch->items[uVar29].ring.items[0].vtx.field_0.m128[1] = fVar50;
        patch->items[uVar29].ring.items[0].vtx.field_0.m128[2] = fVar51;
        patch->items[uVar29].ring.items[0].vtx.field_0.m128[3] = fVar33;
      }
      else if (1 < local_268) {
        fVar48 = (pGVar30->vtx).field_0.m128[0];
        fVar50 = (pGVar30->vtx).field_0.m128[1];
        fVar51 = (pGVar30->vtx).field_0.m128[2];
        fVar33 = (pGVar30->vtx).field_0.m128[3];
        if (local_268 == 2) {
          fVar35 = (local_2d8 + fVar48 * 6.0) * 0.125;
          fVar40 = (fStack_2d4 + fVar50 * 6.0) * 0.125;
          fVar51 = (fStack_2d0 + fVar51 * 6.0) * 0.125;
          fVar41 = (fStack_2cc + fVar33 * 6.0) * 0.125;
          pFVar25 = (pGVar30->faces).data;
          fVar33 = pFVar25[local_238].crease_weight;
          fVar48 = pFVar25[local_230].crease_weight;
          patch->items[uVar29].ring.items[0].vtx.field_0.m128[0] = fVar35;
          patch->items[uVar29].ring.items[0].vtx.field_0.m128[1] = fVar40;
          patch->items[uVar29].ring.items[0].vtx.field_0.m128[2] = fVar51;
          patch->items[uVar29].ring.items[0].vtx.field_0.m128[3] = fVar41;
          fVar50 = (fVar33 * 3.0 + fVar48) * 0.25 + -1.0;
          pDVar1 = &patch->items[uVar29].ring.items[0].crease_weight;
          if ((0x10 < local_238 + 1U) &&
             ((DynamicStackArray<float,_16UL,_64UL> *)
              patch->items[uVar29].ring.items[0].crease_weight.data == pDVar1)) {
            pfVar17 = (float *)operator_new__(0x100);
            patch->items[uVar29].ring.items[0].crease_weight.data = pfVar17;
            lVar15 = 0;
            do {
              patch->items[uVar29].ring.items[0].crease_weight.data[lVar15] = pDVar27->arr[lVar15];
              lVar15 = lVar15 + 1;
            } while (lVar15 != 0x10);
          }
          fVar42 = 0.0;
          if (0.0 <= fVar50) {
            fVar42 = fVar50;
          }
          patch->items[uVar29].ring.items[0].crease_weight.data[lVar32] = fVar42;
          fVar50 = (fVar48 * 3.0 + fVar33) * 0.25 + -1.0;
          pfVar17 = patch->items[uVar29].ring.items[0].crease_weight.data;
          if ((0x10 < lVar12 + 1U) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar17 == pDVar1)) {
            pfVar17 = (float *)operator_new__(0x100);
            patch->items[uVar29].ring.items[0].crease_weight.data = pfVar17;
            lVar32 = 0;
            do {
              patch->items[uVar29].ring.items[0].crease_weight.data[lVar32] = pDVar27->arr[lVar32];
              lVar32 = lVar32 + 1;
            } while (lVar32 != 0x10);
            pfVar17 = patch->items[uVar29].ring.items[0].crease_weight.data;
          }
          fVar42 = 0.0;
          if (0.0 <= fVar50) {
            fVar42 = fVar50;
          }
          pfVar17[lVar12] = fVar42;
          fVar33 = (fVar33 + fVar48) * 0.5;
          if (1.0 <= fVar33) goto LAB_00d74411;
          fVar42 = 1.0 - fVar33;
          fVar48 = fVar35 * fVar42 + fVar45 * fVar33;
          fVar50 = fVar40 * fVar42 + fVar46 * fVar33;
          fVar51 = fVar51 * fVar42 + fVar47 * fVar33;
          fVar33 = fVar41 * fVar42 + fVar49 * fVar33;
        }
        goto LAB_00d745b3;
      }
LAB_00d74411:
      uVar21 = uVar29 + 1;
      patch->items[uVar29].ring.items[0].edge_level = (this->ring).data[uVar29].edge_level * 0.5;
      uVar20 = 0;
      if (uVar21 != uVar31) {
        uVar20 = uVar21;
      }
      patch->items[uVar20].ring.items[3].edge_level = (this->ring).data[uVar29].edge_level * 0.5;
      uVar31 = (ulong)this->N;
      pDVar26 = (DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)((long)(pDVar26 + 5) + 0x1c0);
      pDVar27 = pDVar27 + 0x1a;
      uVar29 = uVar21;
    } while (uVar21 < uVar31);
    if (this->N != 0) {
      pGVar30 = (this->ring).data;
      ppVVar19 = &patch->items[0].ring.items[1].ring.data;
      uVar28 = 1;
      lVar32 = 0;
      uVar29 = 0;
      auVar38 = ZEXT816(0);
      fVar33 = 2.0;
      do {
        iVar23 = (int)uVar29;
        uVar29 = uVar29 + 1;
        uVar20 = 0;
        if (uVar29 != uVar31) {
          uVar20 = uVar29;
        }
        if ((*(int *)((long)&pGVar30->border_face + lVar32) ==
             *(int *)((long)&pGVar30->face_valence + lVar32) + -1) ||
           (pGVar30[uVar20].face_valence < 3)) {
          *(float *)(ppVVar19 + -0x48) = *(float *)((long)ppVVar19 + -0x57c);
          patch->items[uVar20].ring.items[3].vertex_level = *(float *)((long)ppVVar19 + -0x57c);
          *(undefined4 *)((long)ppVVar19 + -0x2fc) = 3;
          patch->items[uVar20].ring.items[3].face_valence = 3;
          *(undefined4 *)(ppVVar19 + -0x5f) = 6;
          patch->items[uVar20].ring.items[3].edge_valence = 6;
          *(undefined4 *)(ppVVar19 + -0x60) = 2;
          patch->items[uVar20].ring.items[3].border_index = 4;
          plVar9 = (long *)ppVVar19[-0x68];
          lVar12 = *plVar9;
          lVar15 = plVar9[1];
          ppVVar19[-0x46] = (Vec3fa *)lVar12;
          ppVVar19[-0x45] = (Vec3fa *)lVar15;
          paVar14 = &patch->items[uVar20].ring;
          *(long *)&paVar14->items[3].vtx.field_0 = lVar12;
          *(long *)((long)&paVar14->items[3].vtx.field_0 + 8) = lVar15;
          *(undefined4 *)((long)ppVVar19 + -0x2f4) = 0;
          patch->items[uVar20].ring.items[3].vertex_crease_weight = 0.0;
          lVar12 = plVar9[2];
          lVar15 = plVar9[3];
          pVVar16 = *ppVVar19;
          *(long *)&pVVar16->field_0 = lVar12;
          *(long *)((long)&pVVar16->field_0 + 8) = lVar15;
          pVVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(long *)&pVVar16[2].field_0 = lVar12;
          *(long *)((long)&pVVar16[2].field_0 + 8) = lVar15;
          pVVar16 = patch->items[uVar20].ring.items[0].ring.data;
          uVar11 = *(undefined8 *)&pVVar16->field_0;
          uVar13 = *(undefined8 *)((long)&pVVar16->field_0 + 8);
          pVVar16 = *ppVVar19;
          *(undefined8 *)&pVVar16[5].field_0 = uVar11;
          *(undefined8 *)((long)&pVVar16[5].field_0 + 8) = uVar13;
          pVVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(undefined8 *)&pVVar16[1].field_0 = uVar11;
          *(undefined8 *)((long)&pVVar16[1].field_0 + 8) = uVar13;
          paVar14 = &patch->items[uVar20].ring;
          uVar11 = *(undefined8 *)&paVar14->items[0].vtx.field_0;
          uVar13 = *(undefined8 *)((long)&paVar14->items[0].vtx.field_0 + 8);
          pVVar16 = *ppVVar19;
          *(undefined8 *)&pVVar16[4].field_0 = uVar11;
          *(undefined8 *)((long)&pVVar16[4].field_0 + 8) = uVar13;
          pVVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(undefined8 *)&pVVar16->field_0 = uVar11;
          *(undefined8 *)((long)&pVVar16->field_0 + 8) = uVar13;
          puVar6 = (undefined8 *)((long)ppVVar19[-0x68] + 0x10 + (long)(int)ppVVar19[-200] * 0x10);
          uVar11 = *puVar6;
          uVar13 = puVar6[1];
          pVVar16 = *ppVVar19;
          *(undefined8 *)&pVVar16[3].field_0 = uVar11;
          *(undefined8 *)((long)&pVVar16[3].field_0 + 8) = uVar13;
          pVVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(undefined8 *)&pVVar16[5].field_0 = uVar11;
          *(undefined8 *)((long)&pVVar16[5].field_0 + 8) = uVar13;
          lVar12 = (long)ppVVar19[-0xae];
          lVar15 = (long)ppVVar19[-0xad];
          pVVar16 = *ppVVar19;
          *(long *)&pVVar16[2].field_0 = lVar12;
          *(long *)((long)&pVVar16[2].field_0 + 8) = lVar15;
          pVVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(long *)&pVVar16[4].field_0 = lVar12;
          *(long *)((long)&pVVar16[4].field_0 + 8) = lVar15;
          uVar11 = *(undefined8 *)((long)ppVVar19[-0x68] + 0x20);
          uVar13 = *(undefined8 *)((long)ppVVar19[-0x68] + 0x28);
          pVVar16 = *ppVVar19;
          *(undefined8 *)&pVVar16[1].field_0 = uVar11;
          *(undefined8 *)((long)&pVVar16[1].field_0 + 8) = uVar13;
          pVVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(undefined8 *)&pVVar16[3].field_0 = uVar11;
          *(undefined8 *)((long)&pVVar16[3].field_0 + 8) = uVar13;
          *(undefined4 *)ppVVar19[-0x50] = 0;
          patch->items[uVar20].ring.items[3].crease_weight.data[1] = 0.0;
          fVar45 = patch->items[uVar20].ring.items[0].crease_weight.data[1];
          *(float *)((long)ppVVar19[-0x50] + 8) = fVar45;
          *patch->items[uVar20].ring.items[3].crease_weight.data = fVar45;
          fVar45 = *(float *)ppVVar19[-0xb8];
          *(float *)((long)ppVVar19[-0x50] + 4) = fVar45;
          patch->items[uVar20].ring.items[3].crease_weight.data[2] = fVar45;
          uVar24 = *(uint *)((long)ppVVar19 + -0x574);
          uVar7 = patch->items[uVar20].ring.items[0].eval_unique_identifier;
          if (uVar7 < uVar24) {
            *(undefined4 *)(ppVVar19 + -0x47) = 2;
            patch->items[uVar20].ring.items[3].eval_start_index = 0;
            *(uint *)((long)ppVVar19 + -0x234) = uVar7;
            patch->items[uVar20].ring.items[3].eval_unique_identifier = uVar7;
          }
          else {
            *(undefined4 *)(ppVVar19 + -0x47) = 1;
            patch->items[uVar20].ring.items[3].eval_start_index = 2;
            *(uint *)((long)ppVVar19 + -0x234) = uVar24;
            patch->items[uVar20].ring.items[3].eval_unique_identifier = uVar24;
          }
        }
        else {
          *(float *)(ppVVar19 + -0x48) = *(float *)((long)ppVVar19 + -0x57c);
          patch->items[uVar20].ring.items[3].vertex_level = *(float *)((long)ppVVar19 + -0x57c);
          *(undefined4 *)((long)ppVVar19 + -0x2fc) = 4;
          patch->items[uVar20].ring.items[3].face_valence = 4;
          *(undefined4 *)(ppVVar19 + -0x5f) = 8;
          patch->items[uVar20].ring.items[3].edge_valence = 8;
          *(undefined4 *)(ppVVar19 + -0x60) = 0xffffffff;
          patch->items[uVar20].ring.items[3].border_index = -1;
          plVar9 = (long *)ppVVar19[-0x68];
          lVar12 = *plVar9;
          lVar15 = plVar9[1];
          ppVVar19[-0x46] = (Vec3fa *)lVar12;
          ppVVar19[-0x45] = (Vec3fa *)lVar15;
          paVar14 = &patch->items[uVar20].ring;
          *(long *)&paVar14->items[3].vtx.field_0 = lVar12;
          *(long *)((long)&paVar14->items[3].vtx.field_0 + 8) = lVar15;
          *(undefined4 *)((long)ppVVar19 + -0x2f4) = 0;
          patch->items[uVar20].ring.items[3].vertex_crease_weight = 0.0;
          lVar12 = plVar9[2];
          lVar15 = plVar9[3];
          pVVar16 = *ppVVar19;
          *(long *)&pVVar16->field_0 = lVar12;
          *(long *)((long)&pVVar16->field_0 + 8) = lVar15;
          pVVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(long *)&pVVar16[2].field_0 = lVar12;
          *(long *)((long)&pVVar16[2].field_0 + 8) = lVar15;
          pVVar16 = patch->items[uVar20].ring.items[0].ring.data;
          uVar11 = *(undefined8 *)&pVVar16->field_0;
          uVar13 = *(undefined8 *)((long)&pVVar16->field_0 + 8);
          pVVar16 = *ppVVar19;
          *(undefined8 *)&pVVar16[7].field_0 = uVar11;
          *(undefined8 *)((long)&pVVar16[7].field_0 + 8) = uVar13;
          pVVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(undefined8 *)&pVVar16[1].field_0 = uVar11;
          *(undefined8 *)((long)&pVVar16[1].field_0 + 8) = uVar13;
          paVar14 = &patch->items[uVar20].ring;
          uVar11 = *(undefined8 *)&paVar14->items[0].vtx.field_0;
          uVar13 = *(undefined8 *)((long)&paVar14->items[0].vtx.field_0 + 8);
          pVVar16 = *ppVVar19;
          *(undefined8 *)&pVVar16[6].field_0 = uVar11;
          *(undefined8 *)((long)&pVVar16[6].field_0 + 8) = uVar13;
          pVVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(undefined8 *)&pVVar16->field_0 = uVar11;
          *(undefined8 *)((long)&pVVar16->field_0 + 8) = uVar13;
          pVVar16 = patch->items[uVar20].ring.items[0].ring.data;
          uVar11 = *(undefined8 *)&pVVar16[4].field_0;
          uVar13 = *(undefined8 *)((long)&pVVar16[4].field_0 + 8);
          pVVar16 = *ppVVar19;
          *(undefined8 *)&pVVar16[5].field_0 = uVar11;
          *(undefined8 *)((long)&pVVar16[5].field_0 + 8) = uVar13;
          pVVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(undefined8 *)&pVVar16[7].field_0 = uVar11;
          *(undefined8 *)((long)&pVVar16[7].field_0 + 8) = uVar13;
          puVar6 = (undefined8 *)((long)ppVVar19[-0x68] + (ulong)((int)ppVVar19[-199] - 1) * 0x10);
          uVar11 = *puVar6;
          uVar13 = puVar6[1];
          pVVar16 = *ppVVar19;
          *(undefined8 *)&pVVar16[4].field_0 = uVar11;
          *(undefined8 *)((long)&pVVar16[4].field_0 + 8) = uVar13;
          pVVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(undefined8 *)&pVVar16[6].field_0 = uVar11;
          *(undefined8 *)((long)&pVVar16[6].field_0 + 8) = uVar13;
          puVar6 = (undefined8 *)((long)ppVVar19[-0x68] + (ulong)((int)ppVVar19[-199] - 2) * 0x10);
          uVar11 = *puVar6;
          uVar13 = puVar6[1];
          pVVar16 = *ppVVar19;
          *(undefined8 *)&pVVar16[3].field_0 = uVar11;
          *(undefined8 *)((long)&pVVar16[3].field_0 + 8) = uVar13;
          pVVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(undefined8 *)&pVVar16[5].field_0 = uVar11;
          *(undefined8 *)((long)&pVVar16[5].field_0 + 8) = uVar13;
          lVar12 = (long)ppVVar19[-0xae];
          lVar15 = (long)ppVVar19[-0xad];
          pVVar16 = *ppVVar19;
          *(long *)&pVVar16[2].field_0 = lVar12;
          *(long *)((long)&pVVar16[2].field_0 + 8) = lVar15;
          pVVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(long *)&pVVar16[4].field_0 = lVar12;
          *(long *)((long)&pVVar16[4].field_0 + 8) = lVar15;
          uVar11 = *(undefined8 *)((long)ppVVar19[-0x68] + 0x20);
          uVar13 = *(undefined8 *)((long)ppVVar19[-0x68] + 0x28);
          pVVar16 = *ppVVar19;
          *(undefined8 *)&pVVar16[1].field_0 = uVar11;
          *(undefined8 *)((long)&pVVar16[1].field_0 + 8) = uVar13;
          pVVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(undefined8 *)&pVVar16[3].field_0 = uVar11;
          *(undefined8 *)((long)&pVVar16[3].field_0 + 8) = uVar13;
          *(undefined4 *)ppVVar19[-0x50] = 0;
          patch->items[uVar20].ring.items[3].crease_weight.data[1] = 0.0;
          fVar45 = patch->items[uVar20].ring.items[0].crease_weight.data[1];
          *(float *)((long)ppVVar19[-0x50] + 0xc) = fVar45;
          *patch->items[uVar20].ring.items[3].crease_weight.data = fVar45;
          *(undefined4 *)((long)ppVVar19[-0x50] + 8) = 0;
          patch->items[uVar20].ring.items[3].crease_weight.data[3] = 0.0;
          fVar45 = *(float *)ppVVar19[-0xb8];
          *(float *)((long)ppVVar19[-0x50] + 4) = fVar45;
          patch->items[uVar20].ring.items[3].crease_weight.data[2] = fVar45;
          uVar24 = *(uint *)((long)ppVVar19 + -0x574);
          uVar7 = patch->items[uVar20].ring.items[0].eval_unique_identifier;
          if (uVar7 < uVar24) {
            *(undefined4 *)(ppVVar19 + -0x47) = 1;
            patch->items[uVar20].ring.items[3].eval_start_index = 2;
            *(uint *)((long)ppVVar19 + -0x234) = uVar7;
            patch->items[uVar20].ring.items[3].eval_unique_identifier = uVar7;
          }
          else {
            *(undefined4 *)(ppVVar19 + -0x47) = 3;
            patch->items[uVar20].ring.items[3].eval_start_index = 0;
            *(uint *)((long)ppVVar19 + -0x234) = uVar24;
            patch->items[uVar20].ring.items[3].eval_unique_identifier = uVar24;
          }
        }
        pGVar30 = (this->ring).data;
        fVar45 = (pGVar30[(ulong)((iVar23 + (int)uVar31) - 1) % uVar31].edge_level +
                 pGVar30[uVar20].edge_level) * 0.25;
        patch->items[uVar20].ring.items[2].edge_level = fVar45;
        *(float *)((long)ppVVar19 + -0x23c) = fVar45;
        if (fVar45 <= fVar33) {
          fVar45 = fVar33;
        }
        pGVar30 = (this->ring).data;
        pfVar17 = (float *)((long)((pGVar30->ring).arr + -4) + lVar32);
        auVar43._0_4_ = auVar38._0_4_ + *pfVar17;
        auVar43._4_4_ = auVar38._4_4_ + pfVar17[1];
        auVar43._8_4_ = auVar38._8_4_ + pfVar17[2];
        auVar43._12_4_ = auVar38._12_4_ + pfVar17[3];
        lVar12 = (long)ppVVar19[-0xad];
        (&local_238)[(ulong)(uVar28 - 1) * 2] = ppVVar19[-0xae];
        *(long *)(afStack_228 + ((ulong)(uVar28 - 1) * 2 + -1) * 2) = lVar12;
        uVar11 = *(undefined8 *)((long)ppVVar19[-0x68] + 8);
        (&local_238)[(ulong)uVar28 * 2] = *(undefined8 *)ppVVar19[-0x68];
        *(undefined8 *)(afStack_228 + ((ulong)uVar28 * 2 + -1) * 2) = uVar11;
        uVar31 = (ulong)this->N;
        lVar32 = lVar32 + 0x380;
        ppVVar19 = ppVVar19 + 0x1a0;
        uVar28 = uVar28 + 2;
        auVar38 = auVar43;
        fVar33 = fVar45;
      } while (uVar29 < uVar31);
      if (this->N != 0) {
        fVar33 = (float)uVar31;
        auVar10._4_4_ = fVar33;
        auVar10._0_4_ = fVar33;
        auVar10._8_4_ = fVar33;
        auVar10._12_4_ = fVar33;
        aVar44 = (anon_union_16_2_47237d3f_for_Vec3fa_0)divps(auVar43,auVar10);
        pDVar26 = &patch->items[0].ring.items[2].ring;
        pDVar27 = &patch->items[0].ring.items[2].crease_weight;
        uVar29 = 0;
        do {
          patch->items[uVar29].ring.items[2].vertex_level = fVar45;
          uVar24 = (uint)uVar31;
          patch->items[uVar29].ring.items[2].face_valence = uVar24;
          uVar28 = uVar24 * 2;
          patch->items[uVar29].ring.items[2].edge_valence = uVar28;
          patch->items[uVar29].ring.items[2].border_index = -1;
          patch->items[uVar29].ring.items[2].vtx.field_0 = aVar44;
          patch->items[uVar29].ring.items[2].vertex_crease_weight = 0.0;
          if (uVar28 != 0) {
            uVar31 = 0;
            do {
              uVar20 = (ulong)((int)uVar29 * 2 + uVar28 + -1 + (int)uVar31) % (ulong)uVar28;
              fVar33 = *(float *)(&local_238 + uVar20 * 2);
              fVar46 = *(float *)((long)&local_238 + uVar20 * 0x10 + 4);
              fVar47 = afStack_228[(uVar20 * 2 + -1) * 2];
              fVar48 = afStack_228[uVar20 * 4 + -1];
              pVVar16 = patch->items[uVar29].ring.items[2].ring.data;
              if ((0x1f < uVar31) &&
                 ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar16 ==
                  &patch->items[uVar29].ring.items[2].ring)) {
                pVVar16 = (Vec3fa *)alignedMalloc(0x800,0x10);
                patch->items[uVar29].ring.items[2].ring.data = pVVar16;
                lVar32 = 0;
                do {
                  puVar6 = (undefined8 *)((long)&pDVar26->arr[0].field_0 + lVar32);
                  uVar11 = puVar6[1];
                  puVar4 = (undefined8 *)
                           ((long)&(patch->items[uVar29].ring.items[2].ring.data)->field_0 + lVar32)
                  ;
                  *puVar4 = *puVar6;
                  puVar4[1] = uVar11;
                  lVar32 = lVar32 + 0x10;
                } while (lVar32 != 0x200);
                pVVar16 = patch->items[uVar29].ring.items[2].ring.data;
              }
              uVar20 = uVar31 + 1;
              pVVar16 = pVVar16 + uVar31;
              (pVVar16->field_0).m128[0] = fVar33;
              (pVVar16->field_0).m128[1] = fVar46;
              (pVVar16->field_0).m128[2] = fVar47;
              (pVVar16->field_0).m128[3] = fVar48;
              uVar31 = uVar20;
            } while (uVar20 != uVar28);
          }
          uVar31 = 0;
          do {
            pfVar17 = patch->items[uVar29].ring.items[2].crease_weight.data;
            if ((0xf < uVar31) &&
               ((DynamicStackArray<float,_16UL,_64UL> *)pfVar17 ==
                &patch->items[uVar29].ring.items[2].crease_weight)) {
              pfVar17 = (float *)operator_new__(0x100);
              patch->items[uVar29].ring.items[2].crease_weight.data = pfVar17;
              lVar32 = 0;
              do {
                patch->items[uVar29].ring.items[2].crease_weight.data[lVar32] = pDVar27->arr[lVar32]
                ;
                lVar32 = lVar32 + 1;
              } while (lVar32 != 0x10);
              pfVar17 = patch->items[uVar29].ring.items[2].crease_weight.data;
            }
            pfVar17[uVar31] = 0.0;
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar24 + (uVar24 == 0));
          uVar28 = uVar28 + (int)uVar29 * -2 >> 1;
          patch->items[uVar29].ring.items[2].eval_start_index = uVar28;
          puVar2 = &patch->items[uVar29].ring.items[2].face_valence;
          if (*puVar2 <= uVar28) {
            patch->items[uVar29].ring.items[2].eval_start_index = uVar28 - *puVar2;
          }
          patch->items[uVar29].ring.items[2].eval_unique_identifier = 0;
          uVar29 = uVar29 + 1;
          uVar31 = (ulong)this->N;
          pDVar26 = (DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)((long)(pDVar26 + 5) + 0x1c0);
          pDVar27 = pDVar27 + 0x1a;
        } while (uVar29 < uVar31);
      }
    }
  }
  return;
}

Assistant:

__noinline void subdivide(array_t<CatmullClarkPatch,SIZE>& patch, unsigned& N_o) const
    {
      N_o = N;
      assert( N );
      for (unsigned i=0; i<N; i++) {
        unsigned ip1 = (i+1)%N; // FIXME: %
        ring[i].subdivide(patch[i].ring[0]);
        patch[i]  .ring[0].edge_level = 0.5f*ring[i].edge_level;
        patch[ip1].ring[3].edge_level = 0.5f*ring[i].edge_level;
        
	assert( patch[i].ring[0].hasValidPositions() );
        
      }
      assert(N < 2*SIZE);
      Vertex_t center = Vertex_t(0.0f);
      array_t<Vertex_t,2*SIZE> center_ring;
      float center_vertex_level = 2.0f; // guarantees that irregular vertices get always isolated also for non-quads
      
      for (unsigned i=0; i<N; i++)
      {
        unsigned ip1 = (i+1)%N; // FIXME: %
        unsigned im1 = (i+N-1)%N; // FIXME: %
        bool regular = ring[i].has_last_face() && ring[ip1].face_valence > 2;
        if (likely(regular)) init_regular(patch[i].ring[0],patch[ip1].ring[0],patch[i].ring[1],patch[ip1].ring[3]); 
        else                 init_border (patch[i].ring[0],patch[ip1].ring[0],patch[i].ring[1],patch[ip1].ring[3]);
        
	assert( patch[i].ring[1].hasValidPositions() );
	assert( patch[ip1].ring[3].hasValidPositions() );
        
	float level = 0.25f*(ring[im1].edge_level+ring[ip1].edge_level);
        patch[i].ring[1].edge_level = patch[ip1].ring[2].edge_level = level;
	center_vertex_level = max(center_vertex_level,level);
        
        center += ring[i].vtx;
        center_ring[2*i+0] = (Vertex_t)patch[i].ring[0].vtx;
        center_ring[2*i+1] = (Vertex_t)patch[i].ring[0].ring[0];
      }
      center /= float(N);
      
      for (unsigned int i=0; i<N; i++) {
        init_regular(center,center_ring,center_vertex_level,N,2*i,patch[i].ring[2]);
        
	assert( patch[i].ring[2].hasValidPositions() );
      }
    }